

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall t_java_generator::generate_java_union(t_java_generator *this,t_struct *tstruct)

{
  bool bVar1;
  string *fromName;
  char *pcVar2;
  ostream *poVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *psVar4;
  int __oflag;
  iterator iStack_310;
  bool is_deprecated;
  allocator local_301;
  key_type local_300;
  _Self local_2e0;
  byte local_2d1;
  undefined1 local_2d0 [7];
  bool is_final;
  string local_2b0;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  undefined1 local_248 [8];
  ofstream_with_content_based_conditional_update f_struct;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string f_struct_name;
  t_struct *tstruct_local;
  t_java_generator *this_local;
  
  f_struct_name.field_2._8_8_ = tstruct;
  std::operator+(&local_78,&this->package_dir_,"/");
  fromName = (string *)(**(code **)(*(long *)f_struct_name.field_2._8_8_ + 0x18))();
  make_valid_java_filename(&local_98,this,fromName);
  std::operator+(&local_58,&local_78,&local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,".java");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_248);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,pcVar2,&local_269);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_248,(char *)local_268,__oflag);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_290);
  poVar3 = std::operator<<((ostream *)local_248,local_290);
  java_package_abi_cxx11_(&local_2b0,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2b0);
  java_suppressions_abi_cxx11_((string *)local_2d0,this);
  std::operator<<(poVar3,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string(local_290);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])
            (this,local_248,f_struct_name.field_2._8_8_);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(f_struct_name.field_2._8_8_ + 0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"final",&local_301);
  local_2e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(this_00,&local_300);
  iStack_310 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(f_struct_name.field_2._8_8_ + 0x30));
  bVar1 = std::operator!=(&local_2e0,&stack0xfffffffffffffcf0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  local_2d1 = bVar1;
  bVar1 = t_java_generator::is_deprecated
                    (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(f_struct_name.field_2._8_8_ + 0x30));
  if ((this->suppress_generated_annotations_ & 1U) == 0) {
    generate_javax_generated_annotation(this,(ostream *)local_248);
  }
  if (bVar1) {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_248);
    poVar3 = std::operator<<(poVar3,"@Deprecated");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_248);
  poVar3 = std::operator<<(poVar3,"public ");
  pcVar2 = "";
  if ((local_2d1 & 1) != 0) {
    pcVar2 = "final ";
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,"class ");
  psVar4 = (string *)(**(code **)(*(long *)f_struct_name.field_2._8_8_ + 0x18))();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," extends org.apache.thrift.TUnion<");
  psVar4 = (string *)(**(code **)(*(long *)f_struct_name.field_2._8_8_ + 0x18))();
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3,", ");
  psVar4 = (string *)(**(code **)(*(long *)f_struct_name.field_2._8_8_ + 0x18))();
  poVar3 = std::operator<<(poVar3,psVar4);
  std::operator<<(poVar3,"._Fields> ");
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)local_248);
  generate_struct_desc(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  generate_field_descs(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_field_name_constants(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_java_meta_data_map(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  generate_union_constructor(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_union_abstract_methods(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_)
  ;
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_java_struct_field_by_id
            (this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_union_getters_and_setters
            (this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_union_is_set_methods(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_union_comparisons(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_union_hashcode(this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_java_struct_write_object
            (this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  generate_java_struct_read_object
            (this,(ostream *)local_248,(t_struct *)f_struct_name.field_2._8_8_);
  std::operator<<((ostream *)local_248,(string *)&::endl_abi_cxx11_);
  poVar3 = (ostream *)local_248;
  t_oop_generator::scope_down(&this->super_t_oop_generator,poVar3);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_248,(int)poVar3);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_248);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_java_generator::generate_java_union(t_struct* tstruct) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + make_valid_java_filename(tstruct->get_name())
                         + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_suppressions();

  generate_java_doc(f_struct, tstruct);

  bool is_final = (tstruct->annotations_.find("final") != tstruct->annotations_.end());
  bool is_deprecated = this->is_deprecated(tstruct->annotations_);

  if (!suppress_generated_annotations_) {
    generate_javax_generated_annotation(f_struct);
  }

  if (is_deprecated) {
    indent(f_struct) << "@Deprecated" << endl;
  }
  indent(f_struct) << "public " << (is_final ? "final " : "") << "class " << tstruct->get_name()
                   << " extends org.apache.thrift.TUnion<" << tstruct->get_name() << ", "
                   << tstruct->get_name() << "._Fields> ";

  scope_up(f_struct);

  generate_struct_desc(f_struct, tstruct);
  generate_field_descs(f_struct, tstruct);

  f_struct << endl;

  generate_field_name_constants(f_struct, tstruct);

  f_struct << endl;

  generate_java_meta_data_map(f_struct, tstruct);

  generate_union_constructor(f_struct, tstruct);

  f_struct << endl;

  generate_union_abstract_methods(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_field_by_id(f_struct, tstruct);

  f_struct << endl;

  generate_union_getters_and_setters(f_struct, tstruct);

  f_struct << endl;

  generate_union_is_set_methods(f_struct, tstruct);

  f_struct << endl;

  generate_union_comparisons(f_struct, tstruct);

  f_struct << endl;

  generate_union_hashcode(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_write_object(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_read_object(f_struct, tstruct);

  f_struct << endl;

  scope_down(f_struct);

  f_struct.close();
}